

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.cpp
# Opt level: O0

void __thiscall
xmrig::HttpContext::HttpContext(HttpContext *this,int parser_type,IHttpListener *listener)

{
  key_type *__k;
  http_parser *parser;
  http_parser *phVar1;
  uv_tcp_t *settings;
  undefined8 uVar2;
  IHttpListener *in_RDX;
  mapped_type in_RDI;
  uint64_t in_stack_ffffffffffffff88;
  HttpData *in_stack_ffffffffffffff90;
  http_parser_type t;
  map<unsigned_long,_xmrig::HttpContext_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_xmrig::HttpContext_*>_>_>
  *in_stack_ffffffffffffffd0;
  
  SEQUENCE = SEQUENCE + 1;
  HttpData::HttpData(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  in_RDI->_vptr_HttpContext = (_func_int **)&PTR__HttpContext_002b78f0;
  in_RDI->m_wasHeaderValue = false;
  in_RDI->m_listener = in_RDX;
  std::__cxx11::string::string((string *)&in_RDI->m_lastHeaderField);
  std::__cxx11::string::string((string *)&in_RDI->m_lastHeaderValue);
  __k = (key_type *)HttpData::id(&in_RDI->super_HttpData);
  parser = (http_parser *)
           std::
           map<unsigned_long,_xmrig::HttpContext_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_xmrig::HttpContext_*>_>_>
           ::operator[](in_stack_ffffffffffffffd0,__k);
  *(mapped_type *)parser = in_RDI;
  phVar1 = (http_parser *)operator_new(0x20);
  in_RDI->m_parser = phVar1;
  settings = (uv_tcp_t *)operator_new(0xf8);
  t = (http_parser_type)((ulong)phVar1 >> 0x20);
  in_RDI->m_tcp = settings;
  uVar2 = uv_default_loop();
  uv_tcp_init(uVar2,in_RDI->m_tcp);
  uv_tcp_nodelay(in_RDI->m_tcp,1);
  http_parser_init(parser,t);
  in_RDI->m_tcp->data = in_RDI;
  in_RDI->m_parser->data = in_RDI;
  if (http_settings._56_8_ == 0) {
    attach((http_parser_settings *)settings);
  }
  return;
}

Assistant:

xmrig::HttpContext::HttpContext(int parser_type, IHttpListener *listener) :
    HttpData(SEQUENCE++),
    m_wasHeaderValue(false),
    m_listener(listener)
{
    storage[id()] = this;

    m_parser = new http_parser;
    m_tcp    = new uv_tcp_t;

    uv_tcp_init(uv_default_loop(), m_tcp);
    uv_tcp_nodelay(m_tcp, 1);

    http_parser_init(m_parser, static_cast<http_parser_type>(parser_type));

    m_parser->data = m_tcp->data = this;

    if (http_settings.on_message_complete == nullptr) {
        attach(&http_settings);
    }
}